

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O0

long __thiscall DNANode::find(DNANode *this,Base *dna,size_t size)

{
  DNANode *nextNode;
  size_t size_local;
  Base *dna_local;
  DNANode *this_local;
  
  if (size == 0) {
    this_local = (DNANode *)this->count;
  }
  else if (this->childNodes[*dna] == (DNANode *)0x0) {
    this_local = (DNANode *)0xffffffffffffffff;
  }
  else {
    this_local = (DNANode *)find(this->childNodes[*dna],dna + 1,size - 1);
  }
  return (long)this_local;
}

Assistant:

long DNANode::find(const DNA::Base* dna, size_t size)
{
    if (!size)
        return count;
    DNANode* nextNode = childNodes[*dna];
    if (nextNode == nullptr)
        return -1;
    else
        return nextNode->find(dna + 1, size - 1);
}